

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# molecule.cpp
# Opt level: O1

Bond_p __thiscall indigox::Molecule::GetBond(Molecule *this,Atom_p *a,Atom_p *b)

{
  element_type *peVar1;
  element_type *peVar2;
  element_type *this_00;
  bool bVar3;
  AtomBondIterator AVar4;
  AtomBondIterator AVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  bool bVar7;
  Molecule_p MVar8;
  Atom_p AVar9;
  Bond_p BVar10;
  undefined1 local_68 [32];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_48;
  CountableObject<indigox::Bond> local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_68._16_8_ = in_RCX;
  MVar8 = Atom::GetMolecule((Atom *)local_68);
  _Var6 = MVar8.super___shared_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  peVar1 = *(element_type **)local_68._0_8_;
  peVar2 = (a->super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if ((element_type *)local_68._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
    _Var6._M_pi = extraout_RDX;
  }
  if (peVar1 == peVar2) {
    MVar8 = Atom::GetMolecule((Atom *)local_68);
    _Var6 = MVar8.super___shared_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
    peVar1 = *(element_type **)local_68._0_8_;
    peVar2 = (a->super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if ((element_type *)local_68._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
      _Var6._M_pi = extraout_RDX_00;
    }
    if (peVar1 == peVar2) {
      for (AVar4 = Atom::BeginBond((b->super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr);
          AVar5 = Atom::EndBond((b->super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr), _Var6._M_pi = extraout_RDX_01,
          AVar4._M_current != AVar5._M_current; AVar4._M_current = AVar4._M_current + 1) {
        std::__shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2> *)this,AVar4._M_current)
        ;
        AVar9 = Bond::GetSourceAtom((Bond *)local_68);
        _Var6 = AVar9.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
        if ((element_type *)local_68._0_8_ ==
            (b->super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>)._M_ptr) {
          AVar9 = Bond::GetTargetAtom((Bond *)&stack0xffffffffffffffc0);
          _Var6 = AVar9.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
          bVar7 = (element_type *)local_40.id_ == (element_type *)*(_func_int ***)local_68._16_8_;
          if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
            _Var6._M_pi = extraout_RDX_02;
          }
        }
        else {
          bVar7 = false;
        }
        if ((element_type *)local_68._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
          _Var6._M_pi = extraout_RDX_03;
        }
        if (bVar7) {
          bVar7 = true;
          bVar3 = false;
        }
        else {
          AVar9 = Bond::GetSourceAtom((Bond *)local_68);
          _Var6 = AVar9.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
          if ((element_type *)local_68._0_8_ == (element_type *)*(_func_int ***)local_68._16_8_) {
            AVar9 = Bond::GetTargetAtom((Bond *)(local_68 + 0x18));
            _Var6 = AVar9.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
            bVar7 = (element_type *)local_68._24_8_ ==
                    (element_type *)
                    (b->super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
              _Var6._M_pi = extraout_RDX_04;
            }
          }
          else {
            bVar7 = false;
          }
          if ((element_type *)local_68._8_8_ != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
            _Var6._M_pi = extraout_RDX_05;
          }
          bVar3 = (bool)(bVar7 ^ 1);
        }
        if ((!bVar7) &&
           (this_00 = (this->super_enable_shared_from_this<indigox::Molecule>)._M_weak_this.
                      super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
           this_00 != (element_type *)0x0)) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
          _Var6._M_pi = extraout_RDX_06;
        }
        if (!bVar3) goto LAB_0010af77;
      }
    }
  }
  (this->super_CountableObject<indigox::Molecule>).id_ = 0;
  (this->super_enable_shared_from_this<indigox::Molecule>)._M_weak_this.
  super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
LAB_0010af77:
  BVar10.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  BVar10.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (Bond_p)BVar10.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Bond_p Molecule::GetBond(Atom_p a, Atom_p b) const {
  /// @todo Logging system calls for fail reasons
  Bond_p bnd = Bond_p();
  if (a->GetMolecule()->GetUniqueID() != GetUniqueID()) return bnd;
  if (b->GetMolecule()->GetUniqueID() != GetUniqueID()) return bnd;
  for (AtomBondIterator it = a->BeginBond(); it != a->EndBond(); ++it) {
    Bond_p tmp = it->lock();
    if (tmp->GetSourceAtom() == a && tmp->GetTargetAtom() == b) return tmp;
    if (tmp->GetSourceAtom() == b && tmp->GetTargetAtom() == a) return tmp;
  }
  return bnd;
}